

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

bool __thiscall
QTableModel::insertColumns(QTableModel *this,int column,int count,QModelIndex *param_4)

{
  QList<QTableWidgetItem_*> *this_00;
  qsizetype qVar1;
  qsizetype qVar2;
  int in_EDX;
  int in_ESI;
  QList<QTableWidgetItem_*> *in_RDI;
  long in_FS_OFFSET;
  int row;
  int cc;
  int rc;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  qsizetype in_stack_ffffffffffffff88;
  QList<QTableWidgetItem_*> *n;
  int local_54;
  bool local_21;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((0 < in_EDX) && (-1 < in_ESI)) {
    this_00 = (QList<QTableWidgetItem_*> *)(long)in_ESI;
    qVar1 = QList<QTableWidgetItem_*>::size(in_RDI + 3);
    if ((long)this_00 <= qVar1) {
      QModelIndex::QModelIndex((QModelIndex *)0x8d405f);
      QAbstractItemModel::beginInsertColumns((QModelIndex *)in_RDI,(int)local_20,in_ESI);
      qVar1 = QList<QTableWidgetItem_*>::size(in_RDI + 2);
      qVar2 = QList<QTableWidgetItem_*>::size(in_RDI + 3);
      QList<QTableWidgetItem_*>::insert
                (in_RDI,(qsizetype)this_00,in_stack_ffffffffffffff88,
                 (parameter_type)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
      if ((int)qVar2 == 0) {
        QList<QTableWidgetItem_*>::resize(this_00,in_stack_ffffffffffffff88);
      }
      else {
        for (local_54 = 0; local_54 < (int)qVar1; local_54 = local_54 + 1) {
          n = in_RDI + 1;
          tableIndex((QTableModel *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
          QList<QTableWidgetItem_*>::insert
                    (in_RDI,(qsizetype)this_00,(qsizetype)n,
                     (parameter_type)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
        }
      }
      QAbstractItemModel::endInsertColumns();
      local_21 = true;
      goto LAB_008d414e;
    }
  }
  local_21 = false;
LAB_008d414e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_21;
}

Assistant:

bool QTableModel::insertColumns(int column, int count, const QModelIndex &)
{
    if (count < 1 || column < 0 || column > horizontalHeaderItems.size())
        return false;

    beginInsertColumns(QModelIndex(), column, column + count - 1);
    int rc = verticalHeaderItems.size();
    int cc = horizontalHeaderItems.size();
    horizontalHeaderItems.insert(column, count, 0);
    if (cc == 0)
        tableItems.resize(rc * count);
    else
        for (int row = 0; row < rc; ++row)
            tableItems.insert(tableIndex(row, column), count, 0);
    endInsertColumns();
    return true;
}